

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

void __thiscall procxx::pipe_streambuf::~pipe_streambuf(pipe_streambuf *this)

{
  pointer pcVar1;
  int in_ESI;
  ulong uVar2;
  
  *(undefined ***)&this->super_pipe_ostreambuf = &PTR__pipe_streambuf_001733b0;
  flush(this);
  pcVar1 = (this->out_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    uVar2 = (long)(this->out_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage - (long)pcVar1;
    operator_delete(pcVar1,uVar2);
    in_ESI = (int)uVar2;
  }
  pipe_t::close(&this->stdin_pipe_,in_ESI);
  pipe_ostreambuf::~pipe_ostreambuf(&this->super_pipe_ostreambuf);
  return;
}

Assistant:

~pipe_streambuf() { flush(); }